

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int __thiscall cmVSLink::LinkNonIncremental(cmVSLink *this)

{
  bool bVar1;
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string mtOut;
  cmVSLink *this_local;
  
  mtOut.field_2._8_8_ = this;
  bVar1 = RunCommand("LINK",&this->LinkCommand,(bool)(this->Verbose & 1),FORMAT_DECIMAL,(int *)0x0,
                     (_func_bool_int *)0x0);
  if (bVar1) {
    if (((this->LinkGeneratesManifest & 1U) == 0) &&
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->UserManifests), bVar1)) {
      this_local._4_4_ = 0;
    }
    else {
      std::operator+(&local_58,"/outputresource:",&this->TargetFile);
      if (this->Type == 1) {
        local_78 = ";#1";
      }
      else {
        local_78 = ";#2";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     &local_58,local_78);
      std::__cxx11::string::~string((string *)&local_58);
      this_local._4_4_ = RunMT(this,(string *)local_38,false);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int cmVSLink::LinkNonIncremental()
{
  // Run the link command (possibly generates intermediate manifest).
  if (!RunCommand("LINK", this->LinkCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // If we have no manifest files we are done.
  if (!this->LinkGeneratesManifest && this->UserManifests.empty()) {
    return 0;
  }

  // Run the manifest tool to embed the final manifest in the binary.
  std::string mtOut =
    "/outputresource:" + this->TargetFile + (this->Type == 1 ? ";#1" : ";#2");
  return this->RunMT(mtOut, false);
}